

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
perfetto::Category::
ForEachGroupMember<perfetto::internal::TrackEventInternal::WriteEvent(perfetto::TraceWriterBase*,perfetto::internal::TrackEventIncrementalState*,perfetto::internal::TrackEventTlsState_const&,perfetto::Category_const*,perfetto::protos::pbzero::TrackEvent_Type,perfetto::TraceTimestamp_const&,bool)::__0>
          (Category *this,anon_class_16_2_6da8f448 callback)

{
  bool bVar1;
  size_t name_size_00;
  size_t name_size;
  size_t i;
  char *name_ptr;
  Category *this_local;
  anon_class_16_2_6da8f448 callback_local;
  
  callback_local.ctx = (EventContext *)callback.track_event;
  this_local = (Category *)callback.ctx;
  i = (size_t)this->name;
  name_size = 0;
  while( true ) {
    name_size_00 = GetNameSize(this,name_size);
    if ((name_size_00 == 0) ||
       (bVar1 = internal::TrackEventInternal::WriteEvent::anon_class_16_2_6da8f448::operator()
                          ((anon_class_16_2_6da8f448 *)&this_local,(char *)i,name_size_00), !bVar1))
    break;
    i = name_size_00 + 1 + i;
    name_size = name_size + 1;
  }
  return;
}

Assistant:

void ForEachGroupMember(T callback) const {
    const char* name_ptr = name;
    size_t i = 0;
    while (size_t name_size = GetNameSize(i++)) {
      if (!callback(name_ptr, name_size))
        break;
      name_ptr += name_size + 1;
    }
  }